

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O0

void quicly_remote_cid_init_set
               (quicly_remote_cid_set_t *set,ptls_iovec_t *initial_cid,
               _func_void_void_ptr_size_t *random_bytes)

{
  ptls_iovec_t src;
  void *__dest;
  code *in_RDX;
  long in_RSI;
  void *in_RDI;
  size_t i;
  uint8_t *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  undefined1 local_90 [8];
  ulong local_88;
  ulong local_58;
  undefined4 local_50 [14];
  code *local_18;
  long local_10;
  void *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_50,0,0x38);
  local_50[0] = 1;
  memcpy(in_RDI,local_50,0x38);
  if (local_10 == 0) {
    (*local_18)((long)local_8 + 0x10,8);
    *(undefined1 *)((long)local_8 + 0x24) = 8;
  }
  else {
    src.len = in_stack_ffffffffffffff60;
    src.base = in_stack_ffffffffffffff58;
    quicly_set_cid((quicly_cid_t *)0x15e294,src);
  }
  (*local_18)((long)local_8 + 0x25);
  for (local_58 = 1; local_58 < 4; local_58 = local_58 + 1) {
    __dest = (void *)((long)local_8 + local_58 * 0x38);
    memset(local_90,0,0x38);
    local_88 = local_58;
    memcpy(__dest,local_90,0x38);
  }
  *(undefined8 *)((long)local_8 + 0xe0) = 3;
  return;
}

Assistant:

void quicly_remote_cid_init_set(quicly_remote_cid_set_t *set, ptls_iovec_t *initial_cid, void (*random_bytes)(void *, size_t))
{
    set->cids[0] = (quicly_remote_cid_t){
        .is_active = 1,
        .sequence = 0,
    };
    if (initial_cid != NULL) {
        quicly_set_cid(&set->cids[0].cid, *initial_cid);
    } else {
        random_bytes(set->cids[0].cid.cid, QUICLY_MIN_INITIAL_DCID_LEN);
        set->cids[0].cid.len = QUICLY_MIN_INITIAL_DCID_LEN;
    }
    random_bytes(set->cids[0].stateless_reset_token, sizeof(set->cids[0].stateless_reset_token));

    for (size_t i = 1; i < PTLS_ELEMENTSOF(set->cids); i++)
        set->cids[i] = (quicly_remote_cid_t){
            .is_active = 0,
            .sequence = i,
        };

    set->_largest_sequence_expected = PTLS_ELEMENTSOF(set->cids) - 1;
}